

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallExportGenerator::GenerateScriptActions
          (cmInstallExportGenerator *this,ostream *os,Indent indent)

{
  undefined8 os_00;
  ostream *poVar1;
  char *permissions_file;
  undefined1 local_110 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  string local_e0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  cmScriptGeneratorIndent local_a8;
  cmScriptGeneratorIndent local_a4;
  Indent indentNNN;
  Indent indentNN;
  Indent indentN;
  string installedFile;
  allocator<char> local_41;
  string local_40 [8];
  string installedDir;
  ostream *os_local;
  cmInstallExportGenerator *this_local;
  Indent indent_local;
  
  installedDir.field_2._8_8_ = os;
  this_local._4_4_ = indent.Level;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"$ENV{DESTDIR}",&local_41);
  std::allocator<char>::~allocator(&local_41);
  cmInstallGenerator::ConvertToAbsoluteDestination
            ((string *)((long)&installedFile.field_2 + 8),&this->super_cmInstallGenerator,
             &(this->super_cmInstallGenerator).Destination);
  std::__cxx11::string::operator+=(local_40,(string *)(installedFile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(installedFile.field_2._M_local_buf + 8));
  std::__cxx11::string::operator+=(local_40,"/");
  std::__cxx11::string::string((string *)&indentN,local_40);
  std::__cxx11::string::operator+=((string *)&indentN,(string *)&this->FileName);
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)this_local._4_4_);
  poVar1 = std::operator<<(poVar1,"if(EXISTS \"");
  poVar1 = std::operator<<(poVar1,(string *)&indentN);
  std::operator<<(poVar1,"\")\n");
  indentNNN.Level =
       (int)cmScriptGeneratorIndent::Next((cmScriptGeneratorIndent *)((long)&this_local + 4),2);
  local_a4 = cmScriptGeneratorIndent::Next(&indentNNN,2);
  local_a8 = cmScriptGeneratorIndent::Next(&local_a4,2);
  local_ac = indentNNN.Level;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)indentNNN.Level);
  poVar1 = std::operator<<(poVar1,"file(DIFFERENT EXPORT_FILE_CHANGED FILES\n");
  local_b0 = indentNNN.Level;
  poVar1 = ::operator<<(poVar1,(cmScriptGeneratorIndent)indentNNN.Level);
  poVar1 = std::operator<<(poVar1,"     \"");
  poVar1 = std::operator<<(poVar1,(string *)&indentN);
  poVar1 = std::operator<<(poVar1,"\"\n");
  local_b4 = indentNNN.Level;
  poVar1 = ::operator<<(poVar1,(cmScriptGeneratorIndent)indentNNN.Level);
  poVar1 = std::operator<<(poVar1,"     \"");
  poVar1 = std::operator<<(poVar1,(string *)&this->MainImportFile);
  std::operator<<(poVar1,"\")\n");
  local_b8 = indentNNN.Level;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)indentNNN.Level);
  std::operator<<(poVar1,"if(EXPORT_FILE_CHANGED)\n");
  local_bc = local_a4.Level;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_a4);
  poVar1 = std::operator<<(poVar1,"file(GLOB OLD_CONFIG_FILES \"");
  poVar1 = std::operator<<(poVar1,local_40);
  cmExportInstallFileGenerator::GetConfigImportFileGlob_abi_cxx11_(&local_e0,this->EFGen);
  poVar1 = std::operator<<(poVar1,(string *)&local_e0);
  std::operator<<(poVar1,"\")\n");
  std::__cxx11::string::~string((string *)&local_e0);
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_a4);
  std::operator<<(poVar1,"if(OLD_CONFIG_FILES)\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_a8);
  poVar1 = std::operator<<(poVar1,"message(STATUS \"Old export file \\\"");
  poVar1 = std::operator<<(poVar1,(string *)&indentN);
  std::operator<<(poVar1,"\\\" will be replaced.  Removing files [${OLD_CONFIG_FILES}].\")\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_a8);
  std::operator<<(poVar1,"file(REMOVE ${OLD_CONFIG_FILES})\n");
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,local_a4);
  std::operator<<(poVar1,"endif()\n");
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = indentNNN.Level;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)indentNNN.Level);
  std::operator<<(poVar1,"endif()\n");
  files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = this_local._4_4_;
  poVar1 = ::operator<<((ostream *)installedDir.field_2._8_8_,
                        (cmScriptGeneratorIndent)this_local._4_4_);
  std::operator<<(poVar1,"endif()\n");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_110);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_110,&this->MainImportFile);
  os_00 = installedDir.field_2._8_8_;
  permissions_file = (char *)std::__cxx11::string::c_str();
  cmInstallGenerator::AddInstallRule
            (&this->super_cmInstallGenerator,(ostream *)os_00,
             &(this->super_cmInstallGenerator).Destination,cmInstallType_FILES,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_110,false,permissions_file,(char *)0x0,(char *)0x0,(char *)0x0,
             this_local._4_4_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_110);
  std::__cxx11::string::~string((string *)&indentN);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmInstallExportGenerator::GenerateScriptActions(std::ostream& os,
                                                     Indent indent)
{
  // Remove old per-configuration export files if the main changes.
  std::string installedDir = "$ENV{DESTDIR}";
  installedDir += this->ConvertToAbsoluteDestination(this->Destination);
  installedDir += "/";
  std::string installedFile = installedDir;
  installedFile += this->FileName;
  os << indent << "if(EXISTS \"" << installedFile << "\")\n";
  Indent indentN = indent.Next();
  Indent indentNN = indentN.Next();
  Indent indentNNN = indentNN.Next();
  /* clang-format off */
  os << indentN << "file(DIFFERENT EXPORT_FILE_CHANGED FILES\n"
     << indentN << "     \"" << installedFile << "\"\n"
     << indentN << "     \"" << this->MainImportFile << "\")\n";
  os << indentN << "if(EXPORT_FILE_CHANGED)\n";
  os << indentNN << "file(GLOB OLD_CONFIG_FILES \"" << installedDir
     << this->EFGen->GetConfigImportFileGlob() << "\")\n";
  os << indentNN << "if(OLD_CONFIG_FILES)\n";
  os << indentNNN << "message(STATUS \"Old export file \\\"" << installedFile
     << "\\\" will be replaced.  Removing files [${OLD_CONFIG_FILES}].\")\n";
  os << indentNNN << "file(REMOVE ${OLD_CONFIG_FILES})\n";
  os << indentNN << "endif()\n";
  os << indentN << "endif()\n";
  os << indent << "endif()\n";
  /* clang-format on */

  // Install the main export file.
  std::vector<std::string> files;
  files.push_back(this->MainImportFile);
  this->AddInstallRule(os, this->Destination, cmInstallType_FILES, files,
                       false, this->FilePermissions.c_str(), nullptr, nullptr,
                       nullptr, indent);
}